

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-circular-array.cc
# Opt level: O3

void __thiscall
CircularArrayTest_empty_Test::~CircularArrayTest_empty_Test(CircularArrayTest_empty_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(CircularArrayTest, empty) {
  CircularArray<TestObject, 2> ca;

  ASSERT_TRUE(ca.empty());

  ca.push_back(TestObject(1));
  ASSERT_FALSE(ca.empty());

  ca.push_back(TestObject(2));
  ASSERT_FALSE(ca.empty());

  ca.pop_back();
  ASSERT_FALSE(ca.empty());

  ca.pop_back();
  ASSERT_TRUE(ca.empty());
}